

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O0

void __thiscall testing::internal::DeathTestImpl::ReadAndInterpretStatusByte(DeathTestImpl *this)

{
  int iVar1;
  int *piVar2;
  ostream *poVar3;
  DeathTestImpl *in_RDI;
  bool bVar4;
  int gtest_retval;
  int bytes_read;
  char flag;
  void *in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe40;
  uint in_stack_fffffffffffffe44;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe48;
  string *in_stack_fffffffffffffe50;
  ostream *in_stack_fffffffffffffe68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe80;
  int in_stack_fffffffffffffeac;
  char *in_stack_fffffffffffffeb0;
  GTestLogSeverity in_stack_fffffffffffffebc;
  GTestLog *in_stack_fffffffffffffec0;
  string local_48 [44];
  int in_stack_ffffffffffffffe4;
  int local_10;
  char local_9;
  
  do {
    read_fd(in_RDI);
    local_10 = posix::Read(in_stack_fffffffffffffe44,in_stack_fffffffffffffe38,0);
    bVar4 = false;
    if (local_10 == -1) {
      piVar2 = __errno_location();
      bVar4 = *piVar2 == 4;
    }
  } while (bVar4);
  if (local_10 == 0) {
    set_outcome(in_RDI,DIED);
  }
  else if (local_10 == 1) {
    switch(local_9) {
    case 'I':
      read_fd(in_RDI);
      FailFromInternalError(in_stack_ffffffffffffffe4);
      break;
    default:
      in_stack_fffffffffffffe78 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &stack0xffffffffffffffec;
      GTestLog::GTestLog(in_stack_fffffffffffffec0,in_stack_fffffffffffffebc,
                         in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac);
      in_stack_fffffffffffffe80 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           GTestLog::GetStream((GTestLog *)in_stack_fffffffffffffe78);
      in_stack_fffffffffffffe70 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::operator<<((ostream *)in_stack_fffffffffffffe80,"Death test child process reported "
                          );
      in_stack_fffffffffffffe68 =
           std::operator<<((ostream *)in_stack_fffffffffffffe70,"unexpected status byte (");
      poVar3 = (ostream *)std::ostream::operator<<(in_stack_fffffffffffffe68,(int)local_9);
      std::operator<<(poVar3,")");
      GTestLog::~GTestLog((GTestLog *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40))
      ;
      break;
    case 'L':
      set_outcome(in_RDI,LIVED);
      break;
    case 'R':
      set_outcome(in_RDI,RETURNED);
      break;
    case 'T':
      set_outcome(in_RDI,THREW);
    }
  }
  else {
    in_stack_fffffffffffffe50 = (string *)(local_48 + 0x20);
    GTestLog::GTestLog(in_stack_fffffffffffffec0,in_stack_fffffffffffffebc,in_stack_fffffffffffffeb0
                       ,in_stack_fffffffffffffeac);
    poVar3 = GTestLog::GetStream((GTestLog *)in_stack_fffffffffffffe50);
    in_stack_fffffffffffffe48 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::operator<<(poVar3,"Read from death test child process failed: ");
    GetLastErrnoDescription_abi_cxx11_();
    std::operator<<((ostream *)in_stack_fffffffffffffe48,local_48);
    std::__cxx11::string::~string(local_48);
    GTestLog::~GTestLog((GTestLog *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
  }
  while( true ) {
    do {
      read_fd(in_RDI);
      iVar1 = posix::Close(0);
      in_stack_fffffffffffffe44 = in_stack_fffffffffffffe44 & 0xffffff;
      if (iVar1 == -1) {
        piVar2 = __errno_location();
        in_stack_fffffffffffffe44 = CONCAT13(*piVar2 == 4,(int3)in_stack_fffffffffffffe44);
      }
    } while ((char)(in_stack_fffffffffffffe44 >> 0x18) != '\0');
    if (iVar1 == -1) break;
    bVar4 = AlwaysFalse();
    if (!bVar4) {
      set_read_fd(in_RDI,-1);
      return;
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe80,(char *)in_stack_fffffffffffffe78,
             (allocator<char> *)in_stack_fffffffffffffe70);
  std::operator+(in_stack_fffffffffffffe48,
                 (char *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
  std::operator+(in_stack_fffffffffffffe48,
                 (char *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
  StreamableToString<int>((int *)in_stack_fffffffffffffe68);
  std::operator+(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
  std::operator+(in_stack_fffffffffffffe48,
                 (char *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
  std::operator+(in_stack_fffffffffffffe48,
                 (char *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
  std::operator+(in_stack_fffffffffffffe48,
                 (char *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
  DeathTestAbort(in_stack_fffffffffffffe50);
}

Assistant:

void DeathTestImpl::ReadAndInterpretStatusByte() {
  char flag;
  int bytes_read;

  // The read() here blocks until data is available (signifying the
  // failure of the death test) or until the pipe is closed (signifying
  // its success), so it's okay to call this in the parent before
  // the child process has exited.
  do {
    bytes_read = posix::Read(read_fd(), &flag, 1);
  } while (bytes_read == -1 && errno == EINTR);

  if (bytes_read == 0) {
    set_outcome(DIED);
  } else if (bytes_read == 1) {
    switch (flag) {
      case kDeathTestReturned:
        set_outcome(RETURNED);
        break;
      case kDeathTestThrew:
        set_outcome(THREW);
        break;
      case kDeathTestLived:
        set_outcome(LIVED);
        break;
      case kDeathTestInternalError:
        FailFromInternalError(read_fd());  // Does not return.
        break;
      default:
        GTEST_LOG_(FATAL) << "Death test child process reported "
                          << "unexpected status byte ("
                          << static_cast<unsigned int>(flag) << ")";
    }
  } else {
    GTEST_LOG_(FATAL) << "Read from death test child process failed: "
                      << GetLastErrnoDescription();
  }
  GTEST_DEATH_TEST_CHECK_SYSCALL_(posix::Close(read_fd()));
  set_read_fd(-1);
}